

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

shared_ptr<aeron::Publication> __thiscall
aeron::archive::AeronArchive::addRecordedPublication
          (AeronArchive *this,string *channel,int32_t streamId)

{
  AeronArchive *pAVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SourcedException *this_00;
  long *plVar4;
  char *pcVar5;
  int32_t in_ECX;
  __pthread_internal_list *p_Var6;
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<aeron::Publication> sVar8;
  allocator local_105;
  int32_t local_104;
  AeronArchive *local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined8 local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = CONCAT44(in_register_00000014,streamId);
  local_104 = in_ECX;
  ClientConductor::addPublication
            ((ClientConductor *)(channel[9]._M_string_length + 0x24b0),(string *)local_d8,in_ECX);
  (this->ctx_).cfg_.messageTimeoutNs = 0;
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)0x0;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->ctx_).cfg_.controlChannel._M_dataplus._M_p;
  local_100 = this;
  while( true ) {
    ClientConductor::findPublication
              ((ClientConductor *)local_f8,channel[9]._M_string_length + 0x24b0);
    uVar3 = local_f8._8_8_;
    uVar2 = local_f8._0_8_;
    local_f8._0_8_ = (_func_int **)0x0;
    local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    pAVar1 = local_100;
    if ((_func_int **)uVar2 != (_func_int **)0x0) break;
    sched_yield();
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  }
  (local_100->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)uVar3;
  (local_100->ctx_).cfg_.messageTimeoutNs = uVar2;
  if (*(_func_int **)(uVar2 + 0x40) == *(_func_int **)(uVar2 + 0x38)) {
    ChannelUri::addSessionId((string *)local_f8,(string *)local_d8,*(int32_t *)(uVar2 + 0x54));
    startRecording((AeronArchive *)channel,(string *)local_f8,local_104,LOCAL);
    _Var7._M_pi = extraout_RDX;
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
      _Var7._M_pi = extraout_RDX_00;
    }
    sVar8.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    sVar8.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pAVar1;
    return (shared_ptr<aeron::Publication>)
           sVar8.super___shared_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::operator+(&local_50,"publication already added for channel=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)*plVar4;
  p_Var6 = (__pthread_internal_list *)(plVar4 + 2);
  if ((__pthread_internal_list *)local_d0._M_dataplus._M_p == p_Var6) {
    local_d0.field_2._M_allocated_capacity = (size_type)p_Var6->__prev;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = (size_type)p_Var6->__prev;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)p_Var6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_70,local_104);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &local_d0,&local_70);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "std::shared_ptr<aeron::Publication> aeron::archive::AeronArchive::addRecordedPublication(const std::string &, std::int32_t)"
             ,"");
  pcVar5 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                     );
  std::__cxx11::string::string((string *)&local_90,pcVar5,&local_105);
  aeron::util::SourcedException::SourcedException
            (this_00,(string *)local_f8,&local_b0,&local_90,0x82);
  *(undefined ***)this_00 = &PTR__SourcedException_00164280;
  __cxa_throw(this_00,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

std::shared_ptr<aeron::Publication> AeronArchive::addRecordedPublication(const std::string& channel,
                                                                         std::int32_t streamId) {
    std::int64_t pubId = aeron_->addPublication(channel, streamId);
    std::shared_ptr<aeron::Publication> publication;
    while (!(publication = aeron_->findPublication(pubId))) {
        std::this_thread::yield();
    }

    if (!publication->isOriginal()) {
        throw ArchiveException(
            "publication already added for channel=" + channel + ", stream id=" + std::to_string(streamId), SOURCEINFO);
    }

    startRecording(ChannelUri::addSessionId(channel, publication->sessionId()), streamId,
                   codecs::SourceLocation::LOCAL);

    return publication;
}